

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall
QDataWidgetMapperPrivate::closeEditor(QDataWidgetMapperPrivate *this,QWidget *w,EndEditHint hint)

{
  int iVar1;
  undefined4 in_EDX;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *in_RSI;
  QDataWidgetMapperPrivate *in_RDI;
  WidgetMapper *unaff_retaddr;
  QDataWidgetMapperPrivate *in_stack_00000008;
  int idx;
  
  iVar1 = findWidget(in_RDI,w);
  if (iVar1 != -1) {
    switch(in_EDX) {
    case 0:
    case 3:
      break;
    case 1:
      QWidget::focusNextChild((QWidget *)0x870709);
      break;
    case 2:
      QWidget::focusPreviousChild((QWidget *)0x870715);
      break;
    case 4:
      std::
      vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
      ::operator[](in_RSI,CONCAT44(in_EDX,iVar1));
      populate(in_stack_00000008,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void QDataWidgetMapperPrivate::closeEditor(QWidget *w, QAbstractItemDelegate::EndEditHint hint)
{
    int idx = findWidget(w);
    if (idx == -1)
        return; // not our widget

    switch (hint) {
    case QAbstractItemDelegate::RevertModelCache: {
        populate(widgetMap[idx]);
        break; }
    case QAbstractItemDelegate::EditNextItem:
        w->focusNextChild();
        break;
    case QAbstractItemDelegate::EditPreviousItem:
        w->focusPreviousChild();
        break;
    case QAbstractItemDelegate::SubmitModelCache:
    case QAbstractItemDelegate::NoHint:
        // nothing
        break;
    }
}